

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folded_integer_bit_decoder.h
# Opt level: O2

void __thiscall
draco::FoldedBit32Decoder<draco::RAnsBitDecoder>::DecodeLeastSignificantBits32
          (FoldedBit32Decoder<draco::RAnsBitDecoder> *this,int nbits,uint32_t *value)

{
  uint32_t uVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar2 = (ulong)(uint)nbits;
  uVar1 = 0;
  if (nbits < 1) {
    uVar2 = 0;
    uVar1 = 0;
  }
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    bVar3 = RAnsBitDecoder::DecodeNextBit((RAnsBitDecoder *)this);
    uVar1 = (uint)bVar3 + uVar1 * 2;
    this = (FoldedBit32Decoder<draco::RAnsBitDecoder> *)&(this->folded_number_decoders_).field_0x18;
  }
  *value = uVar1;
  return;
}

Assistant:

void DecodeLeastSignificantBits32(int nbits, uint32_t *value) {
    uint32_t result = 0;
    for (int i = 0; i < nbits; ++i) {
      const bool bit = folded_number_decoders_[i].DecodeNextBit();
      result = (result << 1) + bit;
    }
    *value = result;
  }